

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varset.h
# Opt level: O1

void __thiscall
libDAI::VarSet::VarSet(VarSet *this,vector<libDAI::Var,_std::allocator<libDAI::Var>_> *ns)

{
  Var *pVVar1;
  bool bVar2;
  ulong uVar3;
  long lVar4;
  __normal_iterator<libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_> _Var5;
  pointer pVVar6;
  pointer pVVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  
  (this->_vars).super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_vars).super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_vars).super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::reserve
            (&this->_vars,
             (long)(ns->super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(ns->super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 4);
  std::vector<libDAI::Var,std::allocator<libDAI::Var>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<libDAI::Var_const*,std::vector<libDAI::Var,std::allocator<libDAI::Var>>>>
            ((vector<libDAI::Var,std::allocator<libDAI::Var>> *)this,
             (this->_vars).super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
             super__Vector_impl_data._M_start,
             (ns->super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>)._M_impl.
             super__Vector_impl_data._M_start,
             (ns->super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>)._M_impl.
             super__Vector_impl_data._M_finish);
  pVVar7 = (this->_vars).super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
           super__Vector_impl_data._M_start;
  pVVar6 = (this->_vars).super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pVVar7 != pVVar6) {
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<libDAI::Var*,std::vector<libDAI::Var,std::allocator<libDAI::Var>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (pVVar7,pVVar6,(int)LZCOUNT((long)pVVar6 - (long)pVVar7 >> 4) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<libDAI::Var*,std::vector<libDAI::Var,std::allocator<libDAI::Var>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pVVar7,pVVar6);
  }
  _Var5 = std::
          __unique<__gnu_cxx::__normal_iterator<libDAI::Var*,std::vector<libDAI::Var,std::allocator<libDAI::Var>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                    ((this->_vars).super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     (this->_vars).super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                     _M_impl.super__Vector_impl_data._M_finish);
  pVVar1 = (this->_vars).super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((_Var5._M_current != pVVar1) &&
     (pVVar7 = (this->_vars).super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
               super__Vector_impl_data._M_finish,
     pVVar6 = (pointer)((long)_Var5._M_current + ((long)pVVar7 - (long)pVVar1)), pVVar7 != pVVar6))
  {
    (this->_vars).super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
    super__Vector_impl_data._M_finish = pVVar6;
  }
  this->_statespace = 1;
  pVVar7 = (this->_vars).super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
           super__Vector_impl_data._M_start;
  pVVar6 = (this->_vars).super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pVVar7 != pVVar6) {
    lVar4 = -0x10 - (long)pVVar7;
    auVar12 = vpbroadcastq_avx512f();
    auVar12 = vpsrlq_avx512f(auVar12,4);
    auVar13 = vpbroadcastq_avx512f(ZEXT816(1));
    uVar8 = 0;
    auVar14 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    vpmovsxbd_avx2(ZEXT816(0x7060504030201000));
    do {
      auVar15 = vmovdqa64_avx512f(auVar13);
      auVar13 = vpbroadcastq_avx512f();
      auVar13 = vporq_avx512f(auVar13,auVar14);
      uVar3 = vpcmpuq_avx512f(auVar13,auVar12,2);
      auVar13 = vpgatherdq_avx512f(*(undefined4 *)((long)&pVVar7->_states + uVar8));
      auVar16._8_8_ = (ulong)((byte)(uVar3 >> 1) & 1) * auVar13._8_8_;
      auVar16._0_8_ = (ulong)((byte)uVar3 & 1) * auVar13._0_8_;
      auVar16._16_8_ = (ulong)((byte)(uVar3 >> 2) & 1) * auVar13._16_8_;
      auVar16._24_8_ = (ulong)((byte)(uVar3 >> 3) & 1) * auVar13._24_8_;
      auVar16._32_8_ = (ulong)((byte)(uVar3 >> 4) & 1) * auVar13._32_8_;
      auVar16._40_8_ = (ulong)((byte)(uVar3 >> 5) & 1) * auVar13._40_8_;
      auVar16._48_8_ = (ulong)((byte)(uVar3 >> 6) & 1) * auVar13._48_8_;
      auVar16._56_8_ = (uVar3 >> 7) * auVar13._56_8_;
      auVar13 = vpmullq_avx512dq(auVar16,auVar15);
      uVar8 = uVar8 + 8;
      pVVar7 = pVVar7 + 8;
    } while ((((ulong)((long)pVVar6 + lVar4) >> 4) + 8 & 0xfffffffffffffff8) != uVar8);
    auVar12 = vmovdqa64_avx512f(auVar13);
    bVar2 = (bool)((byte)uVar3 & 1);
    auVar13._0_8_ = (ulong)bVar2 * auVar12._0_8_ | (ulong)!bVar2 * auVar15._0_8_;
    bVar2 = (bool)((byte)(uVar3 >> 1) & 1);
    auVar13._8_8_ = (ulong)bVar2 * auVar12._8_8_ | (ulong)!bVar2 * auVar15._8_8_;
    bVar2 = (bool)((byte)(uVar3 >> 2) & 1);
    auVar13._16_8_ = (ulong)bVar2 * auVar12._16_8_ | (ulong)!bVar2 * auVar15._16_8_;
    bVar2 = (bool)((byte)(uVar3 >> 3) & 1);
    auVar13._24_8_ = (ulong)bVar2 * auVar12._24_8_ | (ulong)!bVar2 * auVar15._24_8_;
    bVar2 = (bool)((byte)(uVar3 >> 4) & 1);
    auVar13._32_8_ = (ulong)bVar2 * auVar12._32_8_ | (ulong)!bVar2 * auVar15._32_8_;
    bVar2 = (bool)((byte)(uVar3 >> 5) & 1);
    auVar13._40_8_ = (ulong)bVar2 * auVar12._40_8_ | (ulong)!bVar2 * auVar15._40_8_;
    bVar2 = (bool)((byte)(uVar3 >> 6) & 1);
    auVar13._48_8_ = (ulong)bVar2 * auVar12._48_8_ | (ulong)!bVar2 * auVar15._48_8_;
    auVar13._56_8_ = (uVar3 >> 7) * auVar12._56_8_ | (ulong)!SUB81(uVar3 >> 7,0) * auVar15._56_8_;
    auVar11 = vextracti64x4_avx512f(auVar13,1);
    auVar12 = vpmullq_avx512dq(auVar13,ZEXT3264(auVar11));
    auVar9 = vpmullq_avx512vl(auVar12._0_16_,auVar12._16_16_);
    auVar10 = vpshufd_avx(auVar9,0xee);
    auVar10 = vpmullq_avx512vl(auVar9,auVar10);
    this->_statespace = auVar10._0_8_;
  }
  return;
}

Assistant:

VarSet( const std::vector<Var> &ns ) {
                _vars.reserve( ns.size() );
                _vars.insert( _vars.begin(), ns.begin(), ns.end() );
                std::sort( _vars.begin(), _vars.end() );
                std::vector<Var>::iterator new_end = std::unique( _vars.begin(), _vars.end() );
                _vars.erase( new_end, _vars.end() );
                calcStateSpace();
#ifdef DEBUG
                assert( is_sorted( _vars.begin(), _vars.end() ) );
#endif
            }